

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O1

void __thiscall
GenericSection_RoundTripForAnEmptySection_Test::TestBody
          (GenericSection_RoundTripForAnEmptySection_Test *this)

{
  undefined8 uVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  ostream *poVar2;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *message;
  pointer pcVar3;
  section_content *in_R9;
  section_kind kind;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string exported_json;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  parser<pstore::exchange::import_ns::callbacks> parser;
  string_mapping exported_names;
  section_content imported_content;
  section_content exported_content;
  string_mapping imported_names;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *in_stack_fffffffffffffc08;
  section_kind local_3e9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3e8;
  AssertHelper local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  undefined1 local_3d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  long local_3c0 [2];
  string local_3b0;
  AssertHelper local_390;
  undefined1 local_388 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined8 local_358;
  undefined1 local_350 [16];
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  local_340;
  int local_2f0;
  long *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2a0;
  section_content local_268;
  section_content local_188;
  undefined1 local_a8 [56];
  _List_node_base *local_70;
  pointer local_68;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __node_base local_50;
  uint64_t uStack_48;
  float local_40;
  size_t local_38;
  mutex_type *pmStack_30;
  
  local_3e9 = text;
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&local_2a0);
  local_188.kind = text;
  local_188.align = '\x01';
  memset(&local_188.data,0,0xa0);
  local_188.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.data.buffer_ = local_188.data.small_buffer_._M_elems;
  export_section<(pstore::repo::section_kind)0>
            ((string *)local_388,&(this->super_GenericSection).export_db_,
             (string_mapping *)&local_2a0,&local_188,false);
  local_350._0_8_ = &local_368;
  local_368._M_allocated_capacity = 0;
  local_368._8_8_ = 0;
  local_358 = 0;
  local_a8._24_8_ = (long)local_a8 + 0x18;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  local_a8._40_8_ =
       (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0;
  local_a8._48_8_ = local_a8 + 0x30;
  local_68 = (pointer)0x0;
  local_60 = (element_type *)&pmStack_30;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_50._M_nxt = (_Hash_node_base *)0x0;
  uStack_48 = 0;
  local_40 = 1.0;
  local_38 = 0;
  pmStack_30 = (mutex_type *)0x0;
  local_268.kind = text;
  local_268.align = '\x01';
  local_a8._32_8_ = local_a8._24_8_;
  local_70 = (_List_node_base *)local_a8._48_8_;
  memset(&local_268.data,0,0xa0);
  local_268.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.data.buffer_ = local_268.data.small_buffer_._M_elems;
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            ((parser<pstore::exchange::import_ns::callbacks> *)(local_350 + 8),
             (_anonymous_namespace_ *)&(this->super_GenericSection).import_db_,(database *)local_a8,
             (section_kind)&local_268,(string_mapping *)local_350,in_R9,in_stack_fffffffffffffc08);
  uVar1 = local_388._0_8_;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_3d0,local_388._8_8_)
  ;
  local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar1;
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<pstore::exchange::import_ns::callbacks> *)(local_350 + 8),
                       (span<const_char,__1L> *)local_3d0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_3e0.data_._0_4_ = CONCAT31(local_3e0.data_._1_3_,local_2f0 == 0);
  local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_2f0 == 0) {
    local_3b0._M_dataplus._M_p = (pointer)((long)(local_368._8_8_ - local_368._0_8_) >> 3);
    local_3e0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_3d0,"dispatchers.size ()","1U",(unsigned_long *)&local_3b0,
               (uint *)&local_3e0);
    if (local_3d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_3b0._M_dataplus._M_p + 0x10),
                 "Expected a single creation dispatcher to be added to the dispatchers container",
                 0x4e);
      if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_3c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                 ,99,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3b0);
LAB_0016b2dc:
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      if ((long *)local_3b0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_3b0._M_dataplus._M_p + 8))();
      }
    }
    else {
      if (local_3c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3c8,local_3c8);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_3d0,"dispatchers.front ()->kind ()","kind",
                 (section_kind *)(*(long *)local_368._M_allocated_capacity + 8),&local_3e9);
      if (local_3d0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3b0._M_dataplus._M_p + 0x10),
                   "The creation dispatcher should be able to create a text section",0x3f);
        if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_3c8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0x65,message);
        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3b0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e0);
        if ((long *)local_3b0._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_3b0._M_dataplus._M_p + 8))();
        }
      }
      if (local_3c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3c8,local_3c8);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_content,pstore::repo::section_content>
                ((internal *)local_3d0,"exported_content","imported_content",&local_188,&local_268);
      if (local_3d0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_3b0);
        if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_3c8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0x68,pcVar3);
        testing::internal::AssertHelper::operator=(&local_3e0,(Message *)&local_3b0);
        goto LAB_0016b2dc;
      }
    }
    if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0016b30a;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3c8;
    __ptr_00 = local_3c8;
  }
  else {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3d8;
    testing::Message::Message((Message *)&local_3e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3e8._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*local_2e8 + 0x20))(local_3d0,local_2e8,local_2f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3e8._M_head_impl + 0x10),(char *)local_3d0,(long)local_3c8);
    local_3b0._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3e8._M_head_impl + 0x10),(char *)&local_3b0,1);
    local_3b0._M_dataplus._M_p._0_1_ = 0x28;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_3e8._M_head_impl + 0x10),(char *)&local_3b0,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_3b0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_3b0,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_3b0._M_dataplus._M_p._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_3b0,1);
    local_3b0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3e8._M_head_impl + 0x10),(char *)&local_3b0,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3e8._M_head_impl + 0x10),(char *)local_388._0_8_,local_388._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3b0,(internal *)&local_3e0,(AssertionResult *)0x1df922,"true","false",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x5f,local_3b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0 != (undefined1  [8])local_3c0) {
      operator_delete((void *)local_3d0,local_3c0[0] + 1);
    }
    if (local_3e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3e8._M_head_impl + 8))();
    }
    __ptr_00 = local_3d8;
    if (local_3d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0016b30a;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,__ptr_00);
LAB_0016b30a:
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8._M_allocated_capacity + 1);
  }
  if (local_2d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_340);
  if ((pointer)local_350._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_350._8_8_,0x68);
  }
  if (local_268.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_268.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_268.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_a8);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&local_368);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_388 + 0x10)) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (local_188.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_2a0);
  return;
}

Assistant:

TEST_F (GenericSection, RoundTripForAnEmptySection) {
    using namespace pstore::exchange;

    constexpr auto kind = pstore::repo::section_kind::text;
    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::generic_section>::value,
                   "Expected text to map to generic_section");

    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    pstore::repo::section_content exported_content;
    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, false);



    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    import_ns::string_mapping imported_names;
    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer = import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ()
                                       << ' ' << parser.coordinate () << '\n'
                                       << exported_json;

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (exported_content, imported_content);
}